

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::Postprocess_BuildMaterial
          (X3DImporter *this,CX3DImporter_NodeElement *pNodeElement,aiMaterial **pMaterial)

{
  int iVar1;
  long lVar2;
  aiMaterial *this_00;
  DeadlyImportError *pDVar3;
  _List_node_base *p_Var4;
  CX3DImporter_NodeElement_Material *tnemat;
  size_t __n;
  allocator<char> local_469;
  float tvalf;
  undefined4 uStack_464;
  ulong local_460;
  aiMaterial *local_448;
  _List_node_base *local_440;
  aiString url_str;
  
  if (pMaterial == (aiMaterial **)0x0) {
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&url_str,"Postprocess_BuildMaterial. pMaterial is nullptr.",
               (allocator<char> *)&tvalf);
    DeadlyImportError::DeadlyImportError(pDVar3,(string *)&url_str);
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*pMaterial == (aiMaterial *)0x0) {
    this_00 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_00);
    *pMaterial = this_00;
    p_Var4 = (_List_node_base *)&pNodeElement->Child;
    local_448 = this_00;
    local_440 = p_Var4;
    while (p_Var4 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var4 != local_440) {
      lVar2 = (long)p_Var4[1]._M_next;
      iVar1 = *(int *)(lVar2 + 8);
      if (iVar1 == 0x28) {
        lVar2 = (long)p_Var4[1]._M_next;
        url_str.length =
             (ai_uint32)((float)*(undefined8 *)(lVar2 + 100) - (float)*(undefined8 *)(lVar2 + 0x50))
        ;
        url_str.data._0_4_ =
             (float)((ulong)*(undefined8 *)(lVar2 + 100) >> 0x20) -
             (float)((ulong)*(undefined8 *)(lVar2 + 0x50) >> 0x20);
        url_str.data._4_8_ = *(undefined8 *)(lVar2 + 0x5c);
        url_str.data._12_4_ = *(undefined4 *)(lVar2 + 0x58);
        aiMaterial::AddProperty(this_00,(aiUVTransform *)&url_str,1,"$tex.uvtrafo",1,0);
      }
      else if (iVar1 == 0x27) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&tvalf,*(char **)(lVar2 + 0x58),&local_469);
        __n = local_460 & 0xffffffff;
        if ((local_460 & 0xfffffc00) != 0) {
          __n = 0x3ff;
        }
        url_str.length = (ai_uint32)__n;
        memcpy(url_str.data,(void *)CONCAT44(uStack_464,tvalf),__n);
        this_00 = local_448;
        url_str.data[__n] = '\0';
        std::__cxx11::string::~string((string *)&tvalf);
        tvalf = 0.0;
        aiMaterial::AddProperty(this_00,&url_str,"$tex.file",1,0);
        aiMaterial::AddProperty<bool>(this_00,(bool *)(lVar2 + 0x50),1,"$tex.mapmodeu",1,0);
        aiMaterial::AddProperty<bool>(this_00,(bool *)(lVar2 + 0x51),1,"$tex.mapmodev",1,0);
        aiMaterial::AddProperty(this_00,(int *)&tvalf,1,"$tex.op",1,0);
      }
      else if (iVar1 == 0x26) {
        url_str.length = *(ai_uint32 *)(lVar2 + 0x50);
        url_str.data[0] = (char)url_str.length;
        url_str.data[1] = (char)(url_str.length >> 8);
        url_str.data[2] = (char)(url_str.length >> 0x10);
        url_str.data[3] = (char)(url_str.length >> 0x18);
        url_str.data[4] = (char)url_str.length;
        url_str.data[5] = (char)(url_str.length >> 8);
        url_str.data[6] = (char)(url_str.length >> 0x10);
        url_str.data[7] = (char)(url_str.length >> 0x18);
        aiMaterial::AddProperty(this_00,(aiColor3D *)&url_str,1,"$clr.ambient",0,0);
        aiMaterial::AddProperty(this_00,(aiColor3D *)(lVar2 + 0x54),1,"$clr.diffuse",0,0);
        aiMaterial::AddProperty(this_00,(aiColor3D *)(lVar2 + 0x60),1,"$clr.emissive",0,0);
        aiMaterial::AddProperty(this_00,(aiColor3D *)(lVar2 + 0x70),1,"$clr.specular",0,0);
        tvalf = 1.0;
        aiMaterial::AddProperty(this_00,&tvalf,1,"$mat.shinpercent",0,0);
        aiMaterial::AddProperty(this_00,(float *)(lVar2 + 0x6c),1,"$mat.shininess",0,0);
        tvalf = 1.0 - *(float *)(lVar2 + 0x7c);
        aiMaterial::AddProperty(this_00,&tvalf,1,"$mat.opacity",0,0);
      }
    }
    return;
  }
  pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&url_str,"Postprocess_BuildMaterial. *pMaterial must be nullptr.",
             (allocator<char> *)&tvalf);
  DeadlyImportError::DeadlyImportError(pDVar3,(string *)&url_str);
  __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void X3DImporter::Postprocess_BuildMaterial(const CX3DImporter_NodeElement& pNodeElement, aiMaterial** pMaterial) const
{
	// check argument
	if(pMaterial == nullptr) throw DeadlyImportError("Postprocess_BuildMaterial. pMaterial is nullptr.");
	if(*pMaterial != nullptr) throw DeadlyImportError("Postprocess_BuildMaterial. *pMaterial must be nullptr.");

	*pMaterial = new aiMaterial;
	aiMaterial& taimat = **pMaterial;// creating alias for convenience.

	// at this point pNodeElement point to <Appearance> node. Walk through childs and add all stored data.
	for(std::list<CX3DImporter_NodeElement*>::const_iterator el_it = pNodeElement.Child.begin(); el_it != pNodeElement.Child.end(); ++el_it)
	{
		if((*el_it)->Type == CX3DImporter_NodeElement::ENET_Material)
		{
			aiColor3D tcol3;
			float tvalf;
			CX3DImporter_NodeElement_Material& tnemat = *((CX3DImporter_NodeElement_Material*)*el_it);

			tcol3.r = tnemat.AmbientIntensity, tcol3.g = tnemat.AmbientIntensity, tcol3.b = tnemat.AmbientIntensity;
			taimat.AddProperty(&tcol3, 1, AI_MATKEY_COLOR_AMBIENT);
			taimat.AddProperty(&tnemat.DiffuseColor, 1, AI_MATKEY_COLOR_DIFFUSE);
			taimat.AddProperty(&tnemat.EmissiveColor, 1, AI_MATKEY_COLOR_EMISSIVE);
			taimat.AddProperty(&tnemat.SpecularColor, 1, AI_MATKEY_COLOR_SPECULAR);
			tvalf = 1;
			taimat.AddProperty(&tvalf, 1, AI_MATKEY_SHININESS_STRENGTH);
			taimat.AddProperty(&tnemat.Shininess, 1, AI_MATKEY_SHININESS);
			tvalf = 1.0f - tnemat.Transparency;
			taimat.AddProperty(&tvalf, 1, AI_MATKEY_OPACITY);
		}// if((*el_it)->Type == CX3DImporter_NodeElement::ENET_Material)
		else if((*el_it)->Type == CX3DImporter_NodeElement::ENET_ImageTexture)
		{
			CX3DImporter_NodeElement_ImageTexture& tnetex = *((CX3DImporter_NodeElement_ImageTexture*)*el_it);
			aiString url_str(tnetex.URL.c_str());
			int mode = aiTextureOp_Multiply;

			taimat.AddProperty(&url_str, AI_MATKEY_TEXTURE_DIFFUSE(0));
			taimat.AddProperty(&tnetex.RepeatS, 1, AI_MATKEY_MAPPINGMODE_U_DIFFUSE(0));
			taimat.AddProperty(&tnetex.RepeatT, 1, AI_MATKEY_MAPPINGMODE_V_DIFFUSE(0));
			taimat.AddProperty(&mode, 1, AI_MATKEY_TEXOP_DIFFUSE(0));
		}// else if((*el_it)->Type == CX3DImporter_NodeElement::ENET_ImageTexture)
		else if((*el_it)->Type == CX3DImporter_NodeElement::ENET_TextureTransform)
		{
			aiUVTransform trans;
			CX3DImporter_NodeElement_TextureTransform& tnetextr = *((CX3DImporter_NodeElement_TextureTransform*)*el_it);

			trans.mTranslation = tnetextr.Translation - tnetextr.Center;
			trans.mScaling = tnetextr.Scale;
			trans.mRotation = tnetextr.Rotation;
			taimat.AddProperty(&trans, 1, AI_MATKEY_UVTRANSFORM_DIFFUSE(0));
		}// else if((*el_it)->Type == CX3DImporter_NodeElement::ENET_TextureTransform)
	}// for(std::list<CX3DImporter_NodeElement*>::const_iterator el_it = pNodeElement.Child.begin(); el_it != pNodeElement.Child.end(); el_it++)
}